

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_skydome.cpp
# Opt level: O1

void RenderDome(FMaterial *tex,float x_offset,float y_offset,bool mirror,int mode)

{
  short sVar1;
  short sVar2;
  int iVar3;
  int iVar4;
  float x;
  FLOATTYPE y;
  FLOATTYPE local_54;
  
  if (tex == (FMaterial *)0x0) goto LAB_00446d95;
  gl_RenderState.mEffectState = tex->mShaderIndex;
  gl_RenderState.mShaderTimer = (tex->tex->gl_info).shaderspeed;
  FMaterial::Bind(tex,0,0);
  sVar1 = tex->mRenderWidth;
  sVar2 = tex->mRenderHeight;
  iVar4 = (int)sVar2;
  gl_RenderState.mModelMatrixEnabled = true;
  VSMatrix::loadIdentity(&gl_RenderState.mModelMatrix);
  x = 1.0;
  VSMatrix::rotate(&gl_RenderState.mModelMatrix,x_offset + -180.0,0.0,1.0,0.0);
  if (sVar1 < 0x400) {
    x = floorf(1024.0 / (float)(int)sVar1);
  }
  if (sVar2 < 0x80) {
    VSMatrix::translate(&gl_RenderState.mModelMatrix,0.0,-1250.0,0.0);
    VSMatrix::scale(&gl_RenderState.mModelMatrix,1.0,0.5565217,1.0);
    local_54 = (FLOATTYPE)(int)(0x80 / (long)iVar4);
  }
  else {
    if (iVar4 < 200) {
      VSMatrix::translate(&gl_RenderState.mModelMatrix,0.0,-1250.0,0.0);
      y = (float)iVar4 * 0.004347826;
    }
    else {
      iVar3 = (int)tex->tex->SkyOffset;
      if (0xf0 < iVar4) {
        VSMatrix::translate(&gl_RenderState.mModelMatrix,0.0,
                            ((float)(iVar3 + -0x28) + skyoffset.Value) * 57.0,0.0);
        VSMatrix::scale(&gl_RenderState.mModelMatrix,1.0,1.404,1.0);
        local_54 = 240.0 / (float)iVar4;
        goto LAB_00446d2c;
      }
      VSMatrix::translate(&gl_RenderState.mModelMatrix,0.0,
                          ((float)((iVar3 - iVar4) + 200) + skyoffset.Value) * 57.0,0.0);
      y = (float)iVar4 * 0.00585 + -0.16999996;
    }
    local_54 = 1.0;
    VSMatrix::scale(&gl_RenderState.mModelMatrix,1.0,y,1.0);
  }
LAB_00446d2c:
  gl_RenderState.mTextureMatrixEnabled = true;
  VSMatrix::loadIdentity(&gl_RenderState.mTextureMatrix);
  if (mirror) {
    x = -x;
  }
  VSMatrix::scale(&gl_RenderState.mTextureMatrix,x,local_54,1.0);
  VSMatrix::translate(&gl_RenderState.mTextureMatrix,1.0,y_offset / (float)iVar4,1.0);
LAB_00446d95:
  FSkyVertexBuffer::RenderDome(GLRenderer->mSkyVBO,tex,mode);
  gl_RenderState.mModelMatrixEnabled = false;
  gl_RenderState.mTextureMatrixEnabled = false;
  return;
}

Assistant:

void RenderDome(FMaterial * tex, float x_offset, float y_offset, bool mirror, int mode)
{
	int texh = 0;
	int texw = 0;

	// 57 world units roughly represent one sky texel for the glTranslate call.
	const float skyoffsetfactor = 57;

	if (tex)
	{
		gl_RenderState.SetMaterial(tex, CLAMP_NONE, 0, -1, false);
		texw = tex->TextureWidth();
		texh = tex->TextureHeight();
		gl_RenderState.EnableModelMatrix(true);

		gl_RenderState.mModelMatrix.loadIdentity();
		gl_RenderState.mModelMatrix.rotate(-180.0f + x_offset, 0.f, 1.f, 0.f);

		float xscale = texw < 1024.f ? floor(1024.f / float(texw)) : 1.f;
		float yscale = 1.f;
		if (texh < 128)
		{
			// smaller sky textures must be tiled. We restrict it to 128 sky pixels, though
			gl_RenderState.mModelMatrix.translate(0.f, -1250.f, 0.f);
			gl_RenderState.mModelMatrix.scale(1.f, 128 / 230.f, 1.f);
			yscale = 128 / texh;	// intentionally left as integer.
		}
		else if (texh < 200)
		{
			gl_RenderState.mModelMatrix.translate(0.f, -1250.f, 0.f);
			gl_RenderState.mModelMatrix.scale(1.f, texh / 230.f, 1.f);
		}
		else if (texh <= 240)
		{
			gl_RenderState.mModelMatrix.translate(0.f, (200 - texh + tex->tex->SkyOffset + skyoffset)*skyoffsetfactor, 0.f);
			gl_RenderState.mModelMatrix.scale(1.f, 1.f + ((texh - 200.f) / 200.f) * 1.17f, 1.f);
		}
		else
		{
			gl_RenderState.mModelMatrix.translate(0.f, (-40 + tex->tex->SkyOffset + skyoffset)*skyoffsetfactor, 0.f);
			gl_RenderState.mModelMatrix.scale(1.f, 1.2f * 1.17f, 1.f);
			yscale = 240.f / texh;
		}
		gl_RenderState.EnableTextureMatrix(true);
		gl_RenderState.mTextureMatrix.loadIdentity();
		gl_RenderState.mTextureMatrix.scale(mirror ? -xscale : xscale, yscale, 1.f);
		gl_RenderState.mTextureMatrix.translate(1.f, y_offset / texh, 1.f);
	}

	GLRenderer->mSkyVBO->RenderDome(tex, mode);
	gl_RenderState.EnableTextureMatrix(false);
	gl_RenderState.EnableModelMatrix(false);
}